

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  uchar uVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = (uint)pInfo->colUsed;
  if ((long)pInfo->nConstraint < 1) {
    dVar4 = 1000000.0;
  }
  else {
    puVar7 = &pInfo->aConstraint->usable;
    uVar3 = 0xffffffff;
    uVar9 = 0;
    uVar6 = 0xffffffff;
    uVar8 = 0xffffffff;
    do {
      if ((*puVar7 != '\0') && (((sqlite3_index_constraint *)(puVar7 + -5))->iColumn == 0)) {
        uVar1 = puVar7[-1];
        if (uVar1 == '\x02') {
          uVar8 = uVar9 & 0xffffffff;
        }
        if ((uVar1 - 8 & 0xf7) == 0) {
          uVar3 = uVar9 & 0xffffffff;
        }
        if (uVar1 == ' ') {
          uVar6 = uVar9 & 0xffffffff;
        }
        if (uVar1 == '\x04') {
          uVar6 = uVar9 & 0xffffffff;
        }
      }
      uVar9 = uVar9 + 1;
      puVar7 = puVar7 + 0xc;
    } while ((long)pInfo->nConstraint != uVar9);
    if ((int)uVar8 < 0) {
      pInfo->estimatedCost = 1000000.0;
      if ((int)uVar6 < 0) {
        iVar5 = 1;
        dVar4 = 500000.0;
      }
      else {
        uVar2 = uVar2 | 0x200;
        pInfo->aConstraintUsage[uVar6].argvIndex = 1;
        pInfo->estimatedCost = 500000.0;
        iVar5 = 2;
        dVar4 = 250000.0;
      }
      if (-1 < (int)uVar3) {
        uVar2 = uVar2 | 0x400;
        pInfo->aConstraintUsage[uVar3].argvIndex = iVar5;
        pInfo->estimatedCost = dVar4;
      }
      goto LAB_001f3f8f;
    }
    uVar2 = uVar2 | 0x100;
    pInfo->aConstraintUsage[uVar8].argvIndex = 1;
    dVar4 = 100.0;
  }
  pInfo->estimatedCost = dVar4;
LAB_001f3f8f:
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = uVar2;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = (int)pInfo->colUsed;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  assert( (pInfo->colUsed & FTS5_VOCAB_COLUSED_MASK)==pInfo->colUsed );

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1
   && pInfo->aOrderBy[0].iColumn==0
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}